

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall vkt::shaderexecutor::CFloatFunc2::~CFloatFunc2(CFloatFunc2 *this)

{
  CFloatFunc2 *this_local;
  
  (this->super_FloatFunc2).
  super_PrimitiveFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  .
  super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  .super_FuncBase._vptr_FuncBase = (_func_int **)&PTR__CFloatFunc2_01683f78;
  std::__cxx11::string::~string((string *)&this->m_name);
  FloatFunc2::~FloatFunc2(&this->super_FloatFunc2);
  return;
}

Assistant:

CFloatFunc2	(const string&		name,
									 tcu::DoubleFunc2&	func)
							: m_name(name)
							, m_func(func)
	{
	}